

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O3

uint32_t __thiscall cppnet::BufferQueue::Write(BufferQueue *this,char *str,uint32_t len)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  int iVar4;
  BufferBlock *__tmp_1;
  uint32_t uVar5;
  element_type *peVar6;
  
  uVar5 = 0;
  if (len != 0 && str != (char *)0x0) {
    uVar5 = 0;
    while( true ) {
      peVar6 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar6 == (element_type *)0x0) {
        (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])(this);
        peVar6 = (this->_buffer_list)._tail.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var1 = (this->_buffer_list)._tail.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          }
        }
        (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar6;
        p_Var2 = (this->_buffer_write).
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var1;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          peVar6 = (this->_buffer_write).
                   super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
      }
      iVar4 = (*(peVar6->super_InnerBuffer).super_Buffer._vptr_Buffer[10])
                        (peVar6,str + uVar5,(ulong)(len - uVar5));
      uVar5 = uVar5 + iVar4;
      if (len <= uVar5) break;
      peVar6 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar3 = (peVar6->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var1 = (peVar6->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar3;
      p_Var2 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var1;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
    this->_can_read_length = this->_can_read_length + uVar5;
  }
  return uVar5;
}

Assistant:

uint32_t BufferQueue::Write(const char* str, uint32_t len) {
    if (!str || len == 0) {
        return 0;
    }
    
    uint32_t write_len = 0;

    while (1) {
        if (!_buffer_write) {
            Append();
            _buffer_write = _buffer_list.GetTail();
        }

        write_len += _buffer_write->Write(str + write_len, len - write_len);

        if (write_len >= len) {
            break;
        }
        _buffer_write = _buffer_write->GetNext();
    }
    _can_read_length += write_len;
    return write_len;
}